

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

bool_t strEndsWith(char *str,char *suffix)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  char cVar4;
  long lVar5;
  
  sVar2 = strlen(str);
  sVar3 = strlen(suffix);
  bVar1 = 0;
  if (sVar3 <= sVar2) {
    cVar4 = *suffix;
    bVar1 = 1;
    if (cVar4 != '\0') {
      lVar5 = 0;
      do {
        if (str[lVar5 + (sVar2 - sVar3)] != cVar4) {
          return 0;
        }
        cVar4 = suffix[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (cVar4 != '\0');
    }
  }
  return bVar1;
}

Assistant:

bool_t strEndsWith(const char* str, const char* suffix)
{
	ASSERT(strIsValid(str));
	ASSERT(strIsValid(suffix));
	if (strLen(str) < strLen(suffix))
		return FALSE;
	for(str += strLen(str) - strLen(suffix); *suffix; ++suffix, ++str)
		if (*str != *suffix)
			return FALSE;
	return TRUE;
}